

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_0::executeLargePrimaryBufferTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  deInt32 *pdVar1;
  TestStatus *pTVar2;
  Handle<(vk::HandleType)10> HVar3;
  VkResult VVar4;
  VkDevice device;
  DeviceInterface *vk;
  Unique<vk::Handle<(vk::HandleType)10>_> *pUVar5;
  int iVar6;
  long lVar7;
  TestStatus *testResult;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  events;
  VkSubmitInfo submitInfo;
  VkCommandBufferBeginInfo primCmdBufBeginInfo;
  VkCommandPoolCreateInfo cmdPoolParams;
  VkCommandBufferAllocateInfo cmdBufParams;
  undefined1 local_1a8 [8];
  SharedPtrStateBase *local_1a0;
  SharedPtrStateBase local_190;
  long *local_180;
  long local_178;
  long local_170 [2];
  TestStatus *local_160;
  _func_int *local_158;
  DeviceInterface *pDStack_150;
  VkDevice local_148;
  VkAllocationCallbacks *pVStack_140;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  local_138;
  VkQueue local_120;
  VkFence local_118;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_110;
  Move<vk::Handle<(vk::HandleType)10>_> local_f8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  _func_int **local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  VkCommandPool local_a8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_a0;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  VkCommandPoolCreateInfo local_68;
  VkCommandBufferAllocateInfo local_50;
  
  local_160 = __return_storage_ptr__;
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_120 = Context::getUniversalQueue(context);
  local_68.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_68.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_68.pNext = (void *)0x0;
  local_68.flags = 2;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_f8,vk,device,&local_68,
             (VkAllocationCallbacks *)0x0);
  DStack_a0.m_device =
       local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device;
  DStack_a0.m_allocator =
       local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator;
  local_a8.m_internal =
       local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
  DStack_a0.m_deviceIface =
       local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface;
  local_50.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_50.pNext = (void *)0x0;
  local_50.commandPool.m_internal =
       local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
  local_50.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  local_50.commandBufferCount = 1;
  ::vk::allocateCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&local_f8,vk,device,&local_50);
  local_148 = local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device;
  pVStack_140 = local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator;
  local_158 = (_func_int *)
              local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
  pDStack_150 = local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface
  ;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0x2a;
  uStack_80 = 0;
  local_138.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar6 = 10000;
  do {
    pUVar5 = (Unique<vk::Handle<(vk::HandleType)10>_> *)operator_new(0x20);
    ::vk::createEvent(&local_f8,vk,device,0,(VkAllocationCallbacks *)0x0);
    (pUVar5->super_RefBase<vk::Handle<(vk::HandleType)10>_>).m_data.deleter.m_device =
         local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device;
    (pUVar5->super_RefBase<vk::Handle<(vk::HandleType)10>_>).m_data.deleter.m_allocator =
         local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator;
    (pUVar5->super_RefBase<vk::Handle<(vk::HandleType)10>_>).m_data.object.m_internal =
         local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
    (pUVar5->super_RefBase<vk::Handle<(vk::HandleType)10>_>).m_data.deleter.m_deviceIface =
         local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface;
    local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal = 0;
    local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    local_1a0 = (SharedPtrStateBase *)0x0;
    local_1a8 = (undefined1  [8])pUVar5;
    local_1a0 = (SharedPtrStateBase *)operator_new(0x20);
    local_1a0->strongRefCount = 0;
    local_1a0->weakRefCount = 0;
    local_1a0->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d248d0;
    local_1a0[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar5;
    local_1a0->strongRefCount = 1;
    local_1a0->weakRefCount = 1;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>>>
                *)&local_138,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_> *)local_1a8);
    if (local_1a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &local_1a0->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_1a8 = (undefined1  [8])0x0;
        (*local_1a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &local_1a0->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_1a0 != (SharedPtrStateBase *)0x0) {
          (*local_1a0->_vptr_SharedPtrStateBase[1])();
        }
        local_1a0 = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()
                (&local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter,
                 (VkEvent)local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.
                          m_internal);
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  VVar4 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_158,&local_88);
  pTVar2 = local_160;
  ::vk::checkResult(VVar4,"vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x3c2);
  lVar7 = 0;
  do {
    (*vk->_vptr_DeviceInterface[0x6a])
              (vk,local_158,
               **(undefined8 **)
                 ((long)&(local_138.
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar7),0x10000);
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 160000);
  VVar4 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_158);
  ::vk::checkResult(VVar4,"vk.endCommandBuffer(*primCmdBuf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x3ca);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&local_f8,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  HVar3.m_internal =
       local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
  DStack_110.m_device._0_4_ =
       local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device._0_4_;
  DStack_110.m_device._4_4_ =
       local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device._4_4_;
  DStack_110.m_allocator._0_4_ =
       local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._0_4_;
  DStack_110.m_allocator._4_4_ =
       local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._4_4_;
  local_118.m_internal =
       local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
  DStack_110.m_deviceIface =
       local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface;
  local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_d8 = 0;
  uStack_c0 = 0;
  local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_b8 = 0;
  local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal = 4;
  uStack_d0 = 1;
  local_c8 = &local_158;
  VVar4 = (*vk->_vptr_DeviceInterface[2])(vk,local_120,1,&local_f8,HVar3.m_internal);
  ::vk::checkResult(VVar4,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x3dd);
  VVar4 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_118,0,0xffffffffffffffff);
  ::vk::checkResult(VVar4,"vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x3e0);
  tcu::TestStatus::incomplete();
  lVar7 = 0;
  do {
    iVar6 = (*vk->_vptr_DeviceInterface[0x1b])
                      (vk,device,
                       **(undefined8 **)
                         ((long)&(local_138.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar7));
    if (iVar6 != 3) {
      local_180 = local_170;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_180,"An event was not set.","");
      local_1a8._0_4_ = 1;
      local_1a0 = &local_190;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a0,local_180,local_178 + (long)local_180);
      pTVar2->m_code = local_1a8._0_4_;
      std::__cxx11::string::operator=((string *)&pTVar2->m_description,(string *)&local_1a0);
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0,(long)local_190._vptr_SharedPtrStateBase + 1);
      }
      if (local_180 != local_170) {
        operator_delete(local_180,local_170[0] + 1);
      }
      break;
    }
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 160000);
  if (pTVar2->m_code == QP_TEST_RESULT_LAST) {
    local_180 = local_170;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,"All events set correctly.","");
    local_1a8 = (undefined1  [8])((ulong)local_1a8 & 0xffffffff00000000);
    local_1a0 = &local_190;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a0,local_180,local_178 + (long)local_180);
    pTVar2->m_code = local_1a8._0_4_;
    std::__cxx11::string::operator=((string *)&pTVar2->m_description,(string *)&local_1a0);
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0,(long)local_190._vptr_SharedPtrStateBase + 1);
    }
    if (local_180 != local_170) {
      operator_delete(local_180,local_170[0] + 1);
    }
  }
  if (local_118.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_110,local_118);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  ::~vector(&local_138);
  if (local_158 != (_func_int *)0x0) {
    local_f8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal =
         (deUint64)local_158;
    (*pDStack_150->_vptr_DeviceInterface[0x48])(pDStack_150,local_148,pVStack_140,1);
  }
  if (local_a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_a0,local_a8);
  }
  return pTVar2;
}

Assistant:

tcu::TestStatus executeLargePrimaryBufferTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	const deUint32							LARGE_BUFFER_SIZE		= 10000;

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			//	VkCommandPoolCreateFlags	flags;
		queueFamilyIndex,											//	deUint32					queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		*cmdPool,													//	VkCommandPool				pool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							//	VkCommandBufferLevel		level;
		1u,															//	uint32_t					bufferCount;
	};
	const Unique<VkCommandBuffer>			primCmdBuf				(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));
	const VkCommandBufferBeginInfo			primCmdBufBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		0,															// flags
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	std::vector<VkEventSp>					events;
	for (deUint32 ndx = 0; ndx < LARGE_BUFFER_SIZE; ++ndx)
		events.push_back(VkEventSp(new vk::Unique<VkEvent>(createEvent(vk, vkDevice))));

	// record primary command buffer
	VK_CHECK(vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo));
	{
		// set all the events
		for (deUint32 ndx = 0; ndx < LARGE_BUFFER_SIZE; ++ndx)
		{
			vk.cmdSetEvent(*primCmdBuf, events[ndx]->get(), VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
		}
	}
	VK_CHECK(vk.endCommandBuffer(*primCmdBuf));

	// create fence to wait for execution of queue
	const Unique<VkFence>					fence					(createFence(vk, vkDevice));

	const VkSubmitInfo						submitInfo				=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,								// sType
		DE_NULL,													// pNext
		0u,															// waitSemaphoreCount
		DE_NULL,													// pWaitSemaphores
		(const VkPipelineStageFlags*)DE_NULL,						// pWaitDstStageMask
		1,															// commandBufferCount
		&primCmdBuf.get(),											// pCommandBuffers
		0u,															// signalSemaphoreCount
		DE_NULL,													// pSignalSemaphores
	};

	// Submit the command buffer to the queue
	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));

	// wait for end of execution of queue
	VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT));

	// check if the buffer was executed correctly - all events had their status
	// changed
	tcu::TestStatus testResult = tcu::TestStatus::incomplete();

	for (deUint32 ndx = 0; ndx < LARGE_BUFFER_SIZE; ++ndx)
	{
		if (vk.getEventStatus(vkDevice, events[ndx]->get()) != VK_EVENT_SET)
		{
			testResult = tcu::TestStatus::fail("An event was not set.");
			break;
		}
	}

	if (!testResult.isComplete())
		testResult = tcu::TestStatus::pass("All events set correctly.");

	return testResult;
}